

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StronglyRegularToFA.h
# Opt level: O1

void __thiscall
covenant::StronglyRegularToFA<covenant::Sym>::make_fa
          (StronglyRegularToFA<covenant::Sym> *this,State q_0,
          vector<covenant::Sym,_std::allocator<covenant::Sym>_> *alpha,State q_1,
          SymStateMap *SymToState)

{
  int iVar1;
  pointer pvVar2;
  Sym *pSVar3;
  char cVar4;
  pointer pSVar5;
  bool bVar6;
  bool bVar7;
  State SVar8;
  const_iterator cVar9;
  ostream *poVar10;
  ulong uVar11;
  node_pointer ppVar12;
  node_pointer ppVar13;
  pointer pSVar14;
  undefined4 extraout_var;
  vector<int,_std::allocator<int>_> *pvVar15;
  undefined4 extraout_var_00;
  long lVar16;
  pointer pPVar17;
  ulong uVar18;
  ulong uVar19;
  DFA<covenant::Sym> *pDVar20;
  _Alloc_hider _Var21;
  uint uVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__val;
  bool bVar23;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> gamma;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> RHS_1;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> GroupSyms;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> beta;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> beta_1;
  key_type local_2a8;
  ulong local_288;
  StronglyRegularToFA<covenant::Sym> *local_280;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_278;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_260;
  undefined1 local_248 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  DFA<covenant::Sym> *local_228;
  aligned_function *local_220;
  DFA<covenant::Sym> *local_218;
  key_type local_210;
  ulong local_1f0;
  long local_1e8;
  undefined8 local_1e0;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_1d8;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_1c0;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_1a8;
  ulong local_190;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_188;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_170;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_158;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_140;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_128;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_110;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_f8;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_e0;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_c8;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_b0;
  key_type local_98;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_48;
  
  cVar4 = avy::AvyLogFlag;
  if (avy::AvyLogFlag == '\x01') {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"abstraction-mkFA","");
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)avy::AvyLog_abi_cxx11_,&local_98);
    bVar23 = cVar9._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8);
  }
  else {
    bVar23 = false;
  }
  if ((cVar4 != '\0') &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2)) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (bVar23) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading word ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
    pSVar14 = (alpha->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((alpha->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
        super__Vector_impl_data._M_finish != pSVar14) {
      uVar11 = 0;
      uVar18 = 1;
      do {
        poVar10 = operator<<((ostream *)&std::cout,(Sym)pSVar14[uVar11].x);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,";",1);
        pSVar14 = (alpha->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl
                  .super__Vector_impl_data._M_start;
        bVar23 = uVar18 < (ulong)((long)(alpha->
                                        super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar14
                                 >> 2);
        uVar11 = uVar18;
        uVar18 = (ulong)((int)uVar18 + 1);
      } while (bVar23);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," with size ",0xb);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
  }
  cVar4 = avy::AvyLogFlag;
  pSVar14 = (alpha->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar11 = (long)(alpha->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pSVar14 >> 2;
  local_280 = this;
  if (uVar11 == 1) {
    if ((pSVar14->x & 1) == 0) {
      if (avy::AvyLogFlag == '\x01') {
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"abstraction-mkFA","");
        cVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)avy::AvyLog_abi_cxx11_,&local_210);
        bVar23 = cVar9._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8);
      }
      else {
        bVar23 = false;
      }
      if ((cVar4 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2)) {
        operator_delete(local_210._M_dataplus._M_p);
      }
      if (bVar23) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"[make_fa] (case A->a) reading ",0x1e);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
        pSVar14 = (alpha->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl
                  .super__Vector_impl_data._M_start;
        if ((alpha->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
            super__Vector_impl_data._M_finish != pSVar14) {
          uVar11 = 0;
          uVar18 = 1;
          do {
            poVar10 = operator<<((ostream *)&std::cout,(Sym)pSVar14[uVar11].x);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,";",1);
            pSVar14 = (alpha->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            bVar23 = uVar18 < (ulong)((long)(alpha->
                                            super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pSVar14 >> 2);
            uVar11 = uVar18;
            uVar18 = (ulong)((int)uVar18 + 1);
          } while (bVar23);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]",1);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
        std::ostream::put(-0x48);
        std::ostream::flush();
        this = local_280;
      }
      DFA<covenant::Sym>::transition
                (&this->dfa,q_0,
                 (alpha->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
                 super__Vector_impl_data._M_start,q_1);
      return;
    }
  }
  else if (uVar11 == 0) {
    if (avy::AvyLogFlag == '\x01') {
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"abstraction-mkFA","");
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)avy::AvyLog_abi_cxx11_,&local_210);
      bVar23 = cVar9._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8);
    }
    else {
      bVar23 = false;
    }
    if ((cVar4 != '\0') &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2)) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    if (bVar23) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"[make_fa] reading epsilon\n",0x1a);
    }
    DFA<covenant::Sym>::eps_transition(&this->dfa,q_0,q_1);
    return;
  }
  if (uVar11 < 2) {
    if (avy::AvyLogFlag == '\x01') {
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"abstraction-mkFA","");
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)avy::AvyLog_abi_cxx11_,&local_210);
      bVar23 = cVar9._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8);
    }
    else {
      bVar23 = false;
    }
    if ((cVar4 != '\0') &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2)) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    if (bVar23) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"[make_fa] (case A->B) reading ",0x1e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
      pSVar14 = (alpha->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((alpha->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
          super__Vector_impl_data._M_finish != pSVar14) {
        uVar11 = 0;
        uVar18 = 1;
        do {
          poVar10 = operator<<((ostream *)&std::cout,(Sym)pSVar14[uVar11].x);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,";",1);
          pSVar14 = (alpha->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          bVar23 = uVar18 < (ulong)((long)(alpha->
                                          super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)pSVar14 >> 2);
          uVar11 = uVar18;
          uVar18 = (ulong)((int)uVar18 + 1);
        } while (bVar23);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]",1);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
      std::ostream::put(-0x48);
      std::ostream::flush();
      this = local_280;
    }
    uVar22 = ((alpha->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
              super__Vector_impl_data._M_start)->x >> 1;
    uVar11 = (ulong)uVar22;
    local_248._0_4_ = uVar22;
    ppVar12 = boost::unordered::detail::
              table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
              ::find_node_impl<unsigned_int,std::equal_to<unsigned_int>>
                        ((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                          *)&this->sym_scc_map,uVar11,(uint *)local_248,
                         (equal_to<unsigned_int> *)
                         ((this->sym_scc_map).table_.
                          super_functions<boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>.
                          funcs_ + ((this->sym_scc_map).table_.
                                    super_functions<boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>
                                    .current_ & 1)));
    cVar4 = avy::AvyLogFlag;
    if ((this->recursive).
        super__Vector_base<covenant::RecursiveType,_std::allocator<covenant::RecursiveType>_>.
        _M_impl.super__Vector_impl_data._M_start
        [*(uint *)((long)&(ppVar12->value_base_).data_.data_ + 4)] == NON_REC) {
      if (avy::AvyLogFlag == '\x01') {
        local_248._0_8_ = local_248 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"abstraction-mkFA","");
        cVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)avy::AvyLog_abi_cxx11_,(key_type *)local_248);
        bVar23 = cVar9._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8);
      }
      else {
        bVar23 = false;
      }
      if ((cVar4 != '\0') && ((pointer)local_248._0_8_ != (pointer)(local_248 + 0x10))) {
        operator_delete((void *)local_248._0_8_);
      }
      if (bVar23) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"[make_fa] A is not recursive\n ",0x1e);
      }
      pvVar2 = (this->g).prods.
               super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pPVar17 = pvVar2[(int)uVar22].
                super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar2[(int)uVar22].
                   super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                   ._M_impl.super__Vector_impl_data + 8) == pPVar17) {
        return;
      }
      uVar11 = 0;
      uVar18 = 1;
      do {
        std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                  ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_2a8,
                   (this->g).rules.
                   super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + pPVar17[uVar11].rule);
        std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                  (&local_48,(vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_2a8);
        make_fa(this,q_0,&local_48,q_1,SymToState);
        if (local_48.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        pvVar2 = (this->g).prods.
                 super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pPVar17 = pvVar2[(int)uVar22].
                  super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        bVar23 = uVar18 < (ulong)((long)*(pointer *)
                                         ((long)&pvVar2[(int)uVar22].
                                                 super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                                                 ._M_impl.super__Vector_impl_data + 8) -
                                  (long)pPVar17 >> 2);
        uVar11 = uVar18;
        uVar18 = (ulong)((int)uVar18 + 1);
      } while (bVar23);
      return;
    }
    ppVar13 = boost::unordered::detail::
              table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
              ::find_node_impl<unsigned_int,std::equal_to<unsigned_int>>
                        ((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                          *)SymToState,uVar11,(uint *)local_248,
                         (equal_to<unsigned_int> *)
                         ((SymToState->table_).
                          super_functions<boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>.
                          funcs_ + ((SymToState->table_).
                                    super_functions<boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>
                                    .current_ & 1)));
    if (ppVar13 == (node_pointer)0x0) {
      SVar8 = DFA<covenant::Sym>::state
                        (&this->dfa,
                         (int)((ulong)((long)(this->dfa).trans.
                                             super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->dfa).trans.
                                            super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                         -0x55555555);
      local_1f0 = CONCAT44(extraout_var,SVar8.id);
      local_248._0_8_ = local_1f0 << 0x20 | uVar11;
      boost::unordered::detail::
      table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
      ::emplace_unique<std::pair<int,unsigned_int>>
                ((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                  *)SymToState);
    }
    else {
      local_1f0 = (ulong)*(uint *)((long)&(ppVar13->value_base_).data_.data_ + 4);
    }
    local_220 = (SymToState->table_).
                super_functions<boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>.funcs_;
    if ((this->recursive).
        super__Vector_base<covenant::RecursiveType,_std::allocator<covenant::RecursiveType>_>.
        _M_impl.super__Vector_impl_data._M_start
        [*(uint *)((long)&(ppVar12->value_base_).data_.data_ + 4)] == LEFT) {
      if (avy::AvyLogFlag == '\0') {
        bVar23 = false;
      }
      else {
        local_248._0_8_ = local_248 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"abstraction-mkFA","");
        cVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)avy::AvyLog_abi_cxx11_,(key_type *)local_248);
        bVar23 = cVar9._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_248 + 0x10)) {
          operator_delete((void *)local_248._0_8_);
        }
      }
      if (bVar23) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"[make_fa] A is marked as LEFT\n",0x1e);
      }
      pvVar15 = CFGConnect::group(&this->conn,
                                  *(int *)((long)&(ppVar12->value_base_).data_.data_ + 4));
      std::vector<int,_std::allocator<int>_>::vector(&local_60,pvVar15);
      convert_ints_to_symbols
                ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_2a8,this,&local_60)
      ;
      if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((pointer)local_2a8._M_string_length != local_2a8._M_dataplus._M_p) {
        local_218 = &this->dfa;
        pDVar20 = (DFA<covenant::Sym> *)0x0;
        do {
          uVar22 = *(int *)(local_2a8._M_dataplus._M_p + (long)pDVar20 * 4) >> 1;
          local_260.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_260.
                                 super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,uVar22);
          ppVar12 = boost::unordered::detail::
                    table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                    ::find_node_impl<unsigned_int,std::equal_to<unsigned_int>>
                              ((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                                *)SymToState,(ulong)uVar22,(uint *)&local_260,
                               (equal_to<unsigned_int> *)
                               (local_220 +
                               ((SymToState->table_).
                                super_functions<boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>
                                .current_ & 1)));
          local_228 = pDVar20;
          if (ppVar12 == (node_pointer)0x0) {
            SVar8 = DFA<covenant::Sym>::state
                              (local_218,
                               (int)((ulong)((long)(this->dfa).trans.
                                                                                                      
                                                  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(this->dfa).trans.
                                                  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                               -0x55555555);
            local_260.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)CONCAT44(SVar8.id,uVar22);
            boost::unordered::detail::
            table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
            ::emplace_unique<std::pair<int,unsigned_int>>
                      ((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                        *)SymToState,&local_260);
          }
          else {
            SVar8.id = *(uint *)((long)&(ppVar12->value_base_).data_.data_ + 4);
          }
          local_288 = (ulong)SVar8.id;
          lVar16 = (long)(int)uVar22;
          pvVar2 = (this->g).prods.
                   super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_1e8 = lVar16 * 3;
          pPVar17 = pvVar2[lVar16].
                    super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (*(pointer *)
               ((long)&pvVar2[lVar16].
                       super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                       ._M_impl.super__Vector_impl_data + 8) != pPVar17) {
            uVar11 = 0;
            do {
              std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                        (&local_260,
                         (this->g).rules.
                         super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + pPVar17[uVar11].rule);
              std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                        (&local_1a8,&local_260);
              std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                        (&local_140,
                         (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_2a8);
              bVar23 = local_1a8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                       _M_impl.super__Vector_impl_data._M_finish !=
                       local_1a8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              if (bVar23) {
                bVar23 = true;
                uVar18 = 0;
                uVar19 = 1;
                do {
                  bVar6 = std::
                          binary_search<__gnu_cxx::__normal_iterator<covenant::Sym*,std::vector<covenant::Sym,std::allocator<covenant::Sym>>>,covenant::Sym>
                                    ((__normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                                      )local_140.
                                       super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                     (__normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                                      )local_140.
                                       super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                       ._M_impl.super__Vector_impl_data._M_finish,
                                     local_1a8.
                                     super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                     ._M_impl.super__Vector_impl_data._M_start + uVar18);
                  if (bVar6) break;
                  uVar18 = (long)local_1a8.
                                 super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_1a8.
                                 super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 2;
                  bVar23 = uVar19 < uVar18;
                  bVar6 = uVar19 < uVar18;
                  uVar18 = uVar19;
                  uVar19 = (ulong)((int)uVar19 + 1);
                } while (bVar6);
              }
              if (local_140.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                  _M_impl.super__Vector_impl_data._M_start != (Sym *)0x0) {
                operator_delete(local_140.
                                super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_1a8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_1a8.
                                super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (bVar23) {
                bVar23 = std::
                         binary_search<__gnu_cxx::__normal_iterator<covenant::Sym*,std::vector<covenant::Sym,std::allocator<covenant::Sym>>>,covenant::Sym>
                                   ((__normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                                     )local_2a8._M_dataplus._M_p,
                                    (__normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                                     )local_2a8._M_string_length,
                                    local_260.
                                    super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                pSVar5 = local_260.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                pSVar14 = local_260.
                          super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if (bVar23) {
                  std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                            (&local_158,
                             (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_2a8);
                  __val = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)pSVar14 + 4);
                  bVar6 = __val != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                    *)pSVar5;
                  if (bVar6) {
                    bVar6 = true;
                    do {
                      bVar7 = std::
                              binary_search<__gnu_cxx::__normal_iterator<covenant::Sym*,std::vector<covenant::Sym,std::allocator<covenant::Sym>>>,covenant::Sym>
                                        ((__normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                                          )local_158.
                                           super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                           ._M_impl.super__Vector_impl_data._M_start,
                                         (__normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                                          )local_158.
                                           super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                           ._M_impl.super__Vector_impl_data._M_finish,(Sym *)__val);
                      if (bVar7) break;
                      __val = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)((long)__val + 4);
                      bVar6 = __val != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                        *)pSVar5;
                    } while (bVar6);
                  }
                  bVar6 = (bool)(bVar6 ^ 1);
                  this = local_280;
                }
                else {
                  bVar6 = false;
                }
                if ((bVar23) &&
                   (local_158.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                    _M_impl.super__Vector_impl_data._M_start != (Sym *)0x0)) {
                  operator_delete(local_158.
                                  super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if (bVar6) {
                  iVar1 = (local_260.
                           super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl
                           .super__Vector_impl_data._M_start)->x;
                  std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                            (&local_278,&local_260);
                  remove<covenant::Sym>(&local_278,0);
                  uVar22 = iVar1 >> 1;
                  local_1d8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)CONCAT44(local_1d8.
                                         super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar22);
                  ppVar12 = boost::unordered::detail::
                            table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                            ::find_node_impl<unsigned_int,std::equal_to<unsigned_int>>
                                      ((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                                        *)SymToState,(ulong)uVar22,(uint *)&local_1d8,
                                       (equal_to<unsigned_int> *)
                                       (local_220 +
                                       ((SymToState->table_).
                                        super_functions<boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>
                                        .current_ & 1)));
                  if (ppVar12 == (node_pointer)0x0) {
                    SVar8 = DFA<covenant::Sym>::state
                                      (local_218,
                                       (int)((ulong)((long)(local_280->dfa).trans.
                                                                                                                      
                                                  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(local_280->dfa).trans.
                                                                                                                
                                                  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                       -0x55555555);
                    local_1d8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(SVar8.id,uVar22);
                    boost::unordered::detail::
                    table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                    ::emplace_unique<std::pair<int,unsigned_int>>
                              ((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                                *)SymToState,&local_1d8);
                  }
                  else {
                    SVar8.id = *(uint *)((long)&(ppVar12->value_base_).data_.data_ + 4);
                  }
                  std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                            (&local_f8,&local_278);
                  make_fa(local_280,SVar8,&local_f8,(State)(uint)local_288,SymToState);
                  this = local_280;
                  pSVar3 = local_278.
                           super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl
                           .super__Vector_impl_data._M_start;
                  if (local_f8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_f8.
                                    super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                    this = local_280;
                    pSVar3 = local_278.
                             super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                  }
                  goto joined_r0x00153d12;
                }
              }
              else {
                std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                          (&local_e0,&local_260);
                make_fa(this,q_0,&local_e0,(State)(uint)local_288,SymToState);
                pSVar3 = local_e0.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                         _M_impl.super__Vector_impl_data._M_start;
joined_r0x00153d12:
                if (pSVar3 != (Sym *)0x0) {
                  operator_delete(pSVar3);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_260.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                     _M_impl.super__Vector_impl_data._M_start !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_260.
                                super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              uVar11 = (ulong)((int)uVar11 + 1);
              pvVar2 = (this->g).prods.
                       super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pPVar17 = *(pointer *)
                         ((long)&(pvVar2->
                                 super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                                 )._M_impl.super__Vector_impl_data + local_1e8 * 8);
            } while (uVar11 < (ulong)(*(long *)((long)&(pvVar2->
                                                  super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                                                  )._M_impl.super__Vector_impl_data +
                                               local_1e8 * 8 + 8) - (long)pPVar17 >> 2));
          }
          pDVar20 = (DFA<covenant::Sym> *)(ulong)((int)local_228 + 1);
        } while (pDVar20 < (DFA<covenant::Sym> *)
                           ((long)(local_2a8._M_string_length - (long)local_2a8._M_dataplus._M_p) >>
                           2));
      }
      DFA<covenant::Sym>::eps_transition(&this->dfa,(State)(uint)local_1f0,q_1);
      _Var21._M_p = local_2a8._M_dataplus._M_p;
    }
    else {
      if (avy::AvyLogFlag == '\0') {
        bVar23 = false;
      }
      else {
        local_248._0_8_ = local_248 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"abstraction-mkFA","");
        cVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)avy::AvyLog_abi_cxx11_,(key_type *)local_248);
        bVar23 = cVar9._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_248 + 0x10)) {
          operator_delete((void *)local_248._0_8_);
        }
      }
      if (bVar23) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"[make_fa] A is marked as RIGHT/CYCLIC\n",0x26);
      }
      pvVar15 = CFGConnect::group(&this->conn,
                                  *(int *)((long)&(ppVar12->value_base_).data_.data_ + 4));
      std::vector<int,_std::allocator<int>_>::vector(&local_78,pvVar15);
      convert_ints_to_symbols(&local_260,this,&local_78);
      if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_260.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_260.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_228 = &this->dfa;
        uVar11 = 0;
        local_218 = (DFA<covenant::Sym> *)(avy::AvyLog_abi_cxx11_ + 8);
        do {
          uVar22 = *(int *)((long)local_260.
                                  super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                                  _M_impl.super__Vector_impl_data._M_start + uVar11 * 4) >> 1;
          local_278.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_278.
                                 super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,uVar22);
          local_190 = uVar11;
          ppVar12 = boost::unordered::detail::
                    table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                    ::find_node_impl<unsigned_int,std::equal_to<unsigned_int>>
                              ((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                                *)SymToState,(ulong)uVar22,(uint *)&local_278,
                               (equal_to<unsigned_int> *)
                               (local_220 +
                               ((SymToState->table_).
                                super_functions<boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>
                                .current_ & 1)));
          if (ppVar12 == (node_pointer)0x0) {
            SVar8 = DFA<covenant::Sym>::state
                              (local_228,
                               (int)((ulong)((long)(this->dfa).trans.
                                                                                                      
                                                  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(this->dfa).trans.
                                                  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                               -0x55555555);
            local_288 = CONCAT44(extraout_var_00,SVar8.id);
            local_278.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)(local_288 << 0x20 | (ulong)uVar22);
            boost::unordered::detail::
            table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
            ::emplace_unique<std::pair<int,unsigned_int>>
                      ((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                        *)SymToState,&local_278);
          }
          else {
            local_288 = (ulong)*(uint *)((long)&(ppVar12->value_base_).data_.data_ + 4);
          }
          lVar16 = (long)(int)uVar22;
          pvVar2 = (this->g).prods.
                   super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_1e8 = lVar16 * 3;
          pPVar17 = pvVar2[lVar16].
                    super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (*(pointer *)
               ((long)&pvVar2[lVar16].
                       super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                       ._M_impl.super__Vector_impl_data + 8) != pPVar17) {
            uVar11 = 0;
            do {
              std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                        (&local_278,
                         (this->g).rules.
                         super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + pPVar17[uVar11].rule);
              cVar4 = avy::AvyLogFlag;
              if (avy::AvyLogFlag == '\x01') {
                local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_2a8,"abstraction-mkFA","");
                cVar9 = std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)avy::AvyLog_abi_cxx11_,&local_2a8);
                bVar23 = (DFA<covenant::Sym> *)cVar9._M_node != local_218;
              }
              else {
                bVar23 = false;
              }
              if ((cVar4 != '\0') &&
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a8._M_dataplus._M_p != &local_2a8.field_2)) {
                operator_delete(local_2a8._M_dataplus._M_p);
              }
              if (bVar23) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
                if (local_278.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                    _M_impl.super__Vector_impl_data._M_finish !=
                    local_278.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
                  uVar18 = 0;
                  uVar19 = 1;
                  do {
                    poVar10 = operator<<((ostream *)&std::cout,
                                         (Sym)local_278.
                                              super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                              ._M_impl.super__Vector_impl_data._M_start[uVar18].x);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar10,";",1);
                    bVar23 = uVar19 < (ulong)((long)local_278.
                                                                                                        
                                                  super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)local_278.
                                                                                                        
                                                  super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 2);
                    uVar18 = uVar19;
                    uVar19 = (ulong)((int)uVar19 + 1);
                  } while (bVar23);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]",1);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   ",3);
              }
              std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                        (&local_1c0,&local_278);
              std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                        (&local_170,&local_260);
              bVar23 = local_1c0.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                       _M_impl.super__Vector_impl_data._M_finish !=
                       local_1c0.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              if (bVar23) {
                bVar23 = true;
                uVar18 = 0;
                uVar19 = 1;
                do {
                  bVar6 = std::
                          binary_search<__gnu_cxx::__normal_iterator<covenant::Sym*,std::vector<covenant::Sym,std::allocator<covenant::Sym>>>,covenant::Sym>
                                    ((__normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                                      )local_170.
                                       super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                     (__normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                                      )local_170.
                                       super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                       ._M_impl.super__Vector_impl_data._M_finish,
                                     local_1c0.
                                     super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                     ._M_impl.super__Vector_impl_data._M_start + uVar18);
                  if (bVar6) break;
                  uVar18 = (long)local_1c0.
                                 super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_1c0.
                                 super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 2;
                  bVar23 = uVar19 < uVar18;
                  bVar6 = uVar19 < uVar18;
                  uVar18 = uVar19;
                  uVar19 = (ulong)((int)uVar19 + 1);
                } while (bVar6);
              }
              if (local_170.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                  _M_impl.super__Vector_impl_data._M_start != (Sym *)0x0) {
                operator_delete(local_170.
                                super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_1c0.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_1c0.
                                super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (bVar23) {
                bVar23 = std::
                         binary_search<__gnu_cxx::__normal_iterator<covenant::Sym*,std::vector<covenant::Sym,std::allocator<covenant::Sym>>>,covenant::Sym>
                                   ((__normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                                     )local_260.
                                      super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                    (__normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                                     )local_260.
                                      super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                      ._M_impl.super__Vector_impl_data._M_finish,
                                    local_278.
                                    super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + -1);
                pSVar5 = local_278.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                pSVar14 = local_278.
                          super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if (bVar23) {
                  std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                            (&local_188,&local_260);
                  bVar6 = pSVar14 != pSVar5 + -1;
                  if (bVar6) {
                    bVar6 = true;
                    do {
                      bVar7 = std::
                              binary_search<__gnu_cxx::__normal_iterator<covenant::Sym*,std::vector<covenant::Sym,std::allocator<covenant::Sym>>>,covenant::Sym>
                                        ((__normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                                          )local_188.
                                           super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                           ._M_impl.super__Vector_impl_data._M_start,
                                         (__normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                                          )local_188.
                                           super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                           ._M_impl.super__Vector_impl_data._M_finish,pSVar14);
                      if (bVar7) break;
                      pSVar14 = pSVar14 + 1;
                      bVar6 = pSVar14 != pSVar5 + -1;
                    } while (bVar6);
                  }
                  bVar6 = (bool)(bVar6 ^ 1);
                  this = local_280;
                }
                else {
                  bVar6 = false;
                }
                if ((bVar23) &&
                   (local_188.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                    _M_impl.super__Vector_impl_data._M_start != (Sym *)0x0)) {
                  operator_delete(local_188.
                                  super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if (bVar6) {
                  iVar1 = local_278.
                          super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                          super__Vector_impl_data._M_finish[-1].x;
                  std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                            (&local_1d8,&local_278);
                  remove<covenant::Sym>
                            (&local_1d8,
                             ((long)local_278.
                                    super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_278.
                                    super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 2) - 1);
                  uVar22 = iVar1 >> 1;
                  local_1e0 = CONCAT44(local_1e0._4_4_,uVar22);
                  ppVar12 = boost::unordered::detail::
                            table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                            ::find_node_impl<unsigned_int,std::equal_to<unsigned_int>>
                                      ((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                                        *)SymToState,(ulong)uVar22,(uint *)&local_1e0,
                                       (equal_to<unsigned_int> *)
                                       (local_220 +
                                       ((SymToState->table_).
                                        super_functions<boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>
                                        .current_ & 1)));
                  if (ppVar12 == (node_pointer)0x0) {
                    SVar8 = DFA<covenant::Sym>::state
                                      (local_228,
                                       (int)((ulong)((long)(this->dfa).trans.
                                                                                                                      
                                                  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(this->dfa).trans.
                                                                                                                
                                                  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                       -0x55555555);
                    local_1e0 = CONCAT44(SVar8.id,uVar22);
                    boost::unordered::detail::
                    table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                    ::emplace_unique<std::pair<int,unsigned_int>>
                              ((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                                *)SymToState,&local_1e0);
                  }
                  else {
                    SVar8.id = *(uint *)((long)&(ppVar12->value_base_).data_.data_ + 4);
                  }
                  std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                            (&local_128,&local_1d8);
                  make_fa(this,(State)(uint)local_288,&local_128,SVar8,SymToState);
                  pSVar14 = local_1d8.
                            super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  if (local_128.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_128.
                                    super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                    pSVar14 = local_1d8.
                              super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                  }
                  goto joined_r0x00153871;
                }
              }
              else {
                std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                          (&local_110,&local_278);
                make_fa(this,(State)(uint)local_288,&local_110,q_1,SymToState);
                pSVar14 = local_110.
                          super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                          super__Vector_impl_data._M_start;
joined_r0x00153871:
                if (pSVar14 != (pointer)0x0) {
                  operator_delete(pSVar14);
                }
              }
              if (local_278.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                  _M_impl.super__Vector_impl_data._M_start != (Sym *)0x0) {
                operator_delete(local_278.
                                super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              uVar11 = (ulong)((int)uVar11 + 1);
              pvVar2 = (this->g).prods.
                       super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pPVar17 = *(pointer *)
                         ((long)&(pvVar2->
                                 super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                                 )._M_impl.super__Vector_impl_data + local_1e8 * 8);
            } while (uVar11 < (ulong)(*(long *)((long)&(pvVar2->
                                                  super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                                                  )._M_impl.super__Vector_impl_data +
                                               local_1e8 * 8 + 8) - (long)pPVar17 >> 2));
          }
          uVar11 = (ulong)((int)local_190 + 1);
        } while (uVar11 < (ulong)((long)local_260.
                                        super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_260.
                                        super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 2));
      }
      DFA<covenant::Sym>::eps_transition(&this->dfa,q_0,(State)(uint)local_1f0);
      _Var21._M_p = (pointer)local_260.
                             super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                             _M_impl.super__Vector_impl_data._M_start;
    }
  }
  else {
    std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
              ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)local_248,alpha);
    remove<covenant::Sym>((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)local_248,0);
    SVar8 = DFA<covenant::Sym>::state
                      (&this->dfa,
                       (int)((ulong)((long)(this->dfa).trans.
                                           super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->dfa).trans.
                                          super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                       -0x55555555);
    local_2a8._M_dataplus._M_p = (pointer)0x0;
    local_2a8._M_string_length = 0;
    local_2a8.field_2._M_allocated_capacity = 0;
    std::vector<covenant::Sym,std::allocator<covenant::Sym>>::
    _M_realloc_insert<covenant::Sym_const&>
              ((vector<covenant::Sym,std::allocator<covenant::Sym>> *)&local_2a8,(iterator)0x0,
               (alpha->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
               super__Vector_impl_data._M_start);
    cVar4 = avy::AvyLogFlag;
    if (avy::AvyLogFlag == '\x01') {
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"abstraction-mkFA","");
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)avy::AvyLog_abi_cxx11_,&local_210);
      bVar23 = cVar9._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8);
    }
    else {
      bVar23 = false;
    }
    if ((cVar4 != '\0') &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2)) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    if (bVar23) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"[make_fa] (case A-> BC) reading ",0x20);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
      if ((pointer)local_2a8._M_string_length != local_2a8._M_dataplus._M_p) {
        uVar11 = 0;
        uVar18 = 1;
        do {
          poVar10 = operator<<((ostream *)&std::cout,
                               (Sym)*(int *)(local_2a8._M_dataplus._M_p + uVar11 * 4));
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,";",1);
          bVar23 = uVar18 < (ulong)((long)(local_2a8._M_string_length -
                                          (long)local_2a8._M_dataplus._M_p) >> 2);
          uVar11 = uVar18;
          uVar18 = (ulong)((int)uVar18 + 1);
        } while (bVar23);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
      if (local_248._8_8_ != local_248._0_8_) {
        uVar11 = 0;
        uVar18 = 1;
        do {
          poVar10 = operator<<((ostream *)&std::cout,(Sym)*(int *)(local_248._0_8_ + uVar11 * 4));
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,";",1);
          bVar23 = uVar18 < (ulong)((long)(local_248._8_8_ - local_248._0_8_) >> 2);
          uVar11 = uVar18;
          uVar18 = (ulong)((int)uVar18 + 1);
        } while (bVar23);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]",1);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
      std::ostream::put(-0x48);
      std::ostream::flush();
    }
    std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
              (&local_b0,(vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_2a8);
    make_fa(this,q_0,&local_b0,SVar8,SymToState);
    if (local_b0.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
              (&local_c8,(vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)local_248);
    make_fa(this,SVar8,&local_c8,q_1,SymToState);
    if (local_c8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    _Var21._M_p = (pointer)local_248._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_2a8._M_dataplus._M_p);
      _Var21._M_p = (pointer)local_248._0_8_;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var21._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(_Var21._M_p);
  }
  return;
}

Assistant:

void make_fa(const State q_0, 
               const vector<EdgeSym> alpha, 
               const State q_1, 
               SymStateMap &SymToState) 
  {

    LOG ("abstraction-mkFA", 
         cout << "reading word " << alpha 
         << " with size " << alpha.size() << endl);

    if (alpha.size() == 0)
    {

      LOG ("abstraction-mkFA", 
           cout << "[make_fa] reading epsilon\n");

      dfa.eps_transition(q_0,q_1);
      return;
    }
    else if (alpha.size () == 1 && alpha[0].isTerm ())
    {

      LOG ("abstraction-mkFA", 
           cout << "[make_fa] (case A->a) reading " << alpha << endl);

      dfa.transition(q_0, alpha[0], q_1);
      return;
    }
    else if (alpha.size() >= 2)
    {
      vector<EdgeSym> beta(alpha);
      remove(beta,0);
      State q_2 = dfa.state(dfa.nStates());
      vector<EdgeSym> gamma;
      gamma.push_back(alpha[0]);

      LOG ("abstraction-mkFA",
           cout << "[make_fa] (case A-> BC) reading " << gamma << " " 
           << beta << endl);

      make_fa(q_0, gamma, q_2, SymToState);
      make_fa(q_2, beta , q_1, SymToState);
      return;
    }
    else
    {
      //assert(alpha.size() == 1 && isVar(alpha[0]));

      LOG ("abstraction-mkFA", 
           cout << "[make_fa] (case A->B) reading " << alpha << endl);

      EdgeSym A =  alpha[0];	
      SymSCCMap::iterator It = sym_scc_map.find(A.symID ());
      if (recursive[(*It).second] == NON_REC)
      {

        LOG ("abstraction-mkFA", 
             cout << "[make_fa] A is not recursive\n ");

        for ( unsigned int ri = 0; ri < g.prods[A.symID()].size(); ri++ )
        {
          int r = g.prods[A.symID ()][ri].rule;
          vector<EdgeSym> RHS = g.rules[r];
          make_fa(q_0, RHS, q_1, SymToState);
        }
        return;
      }
        
      State q_A = MapSymToState(SymToState, A);
      if (recursive[(*It).second] == LEFT)
      {

        LOG ("abstraction-mkFA", 
             cout << "[make_fa] A is marked as LEFT\n");

        // GroupSyms must be sorted
        vector<EdgeSym> GroupSyms = convert_ints_to_symbols(conn.group((*It).second));
        for (unsigned int gi =0; gi < GroupSyms.size() ; gi ++)
        {
          EdgeSym C = GroupSyms[gi];
          State q_C = MapSymToState(SymToState, C);
          for ( unsigned int ri = 0; ri < g.prods[C.symID ()].size(); ri++ )
          {
            int r = g.prods[C.symID ()][ri].rule;
            vector<EdgeSym> RHS = g.rules[r];
              
            if (!intersect_unorder_ord(RHS, GroupSyms))
              make_fa(q_0, RHS, q_C, SymToState);
            else{
              if (binary_search(GroupSyms.begin(),GroupSyms.end(), RHS[0]) &&
                  (!intersect_unorder_ord(++RHS.begin(), RHS.end(), GroupSyms)))
              {
                EdgeSym D = RHS[0];
                vector<EdgeSym> beta(RHS);
                remove(beta,0);
                State q_D = MapSymToState(SymToState, D);
                make_fa(q_D, beta, q_C, SymToState);
              }		    
            }
          }
        }
        dfa.eps_transition(q_A,q_1);
      } // end LEFT
      else
      {
        /////
        // RIGHT or CYCLIC: code almost identical
        /////

        LOG ("abstraction-mkFA", 
             cout << "[make_fa] A is marked as RIGHT/CYCLIC\n"); 

        vector<EdgeSym> GroupSyms = convert_ints_to_symbols(conn.group((*It).second));
        for (unsigned int gi =0; gi < GroupSyms.size() ; gi ++)
        {
          EdgeSym C = GroupSyms[gi];
          State q_C = MapSymToState(SymToState, C);
          for ( unsigned int ri = 0; ri < g.prods[C.symID ()].size(); ri++ )
          {
            int r = g.prods[C.symID ()][ri].rule;
            vector<EdgeSym> RHS = g.rules[r];

            LOG ("abstraction-mkFA", cout << RHS << "   " );

            if (!intersect_unorder_ord(RHS, GroupSyms))
              make_fa(q_C, RHS, q_1, SymToState);
            else
            {
              if (binary_search(GroupSyms.begin(),GroupSyms.end(), RHS[RHS.size()-1]) &&
                  (!intersect_unorder_ord(RHS.begin(), RHS.end()-1, GroupSyms)))
              {
                EdgeSym D = RHS[RHS.size()-1];
                vector<EdgeSym> beta(RHS);
                remove(beta,RHS.size()-1);
                State q_D = MapSymToState(SymToState, D);
                make_fa(q_C, beta, q_D,  SymToState);
              }		    
            }
          }
        }
        dfa.eps_transition(q_0,q_A);
      } // end RIGHT or CYCLIC	
      return;
    }
  }